

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTableType(CWriter *this,Type *type)

{
  char *local_20;
  Type *local_18;
  Type *type_local;
  CWriter *this_local;
  
  local_18 = type;
  type_local = (Type *)this;
  local_20 = GetReferenceTypeName(type);
  (anonymous_namespace)::CWriter::Write<char_const(&)[9],char_const*,char_const(&)[9]>
            ((CWriter *)this,(char (*) [9])"wasm_rt_",&local_20,(char (*) [9])"_table_t");
  return;
}

Assistant:

void CWriter::WriteTableType(const wabt::Type& type) {
  Write("wasm_rt_", GetReferenceTypeName(type), "_table_t");
}